

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O3

bool checkCreterion(Mesh *mesh,VectorXd *x,double epsilon)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double *pdVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int i;
  int iVar11;
  long lVar12;
  _Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true> _Var13;
  long lVar14;
  uint uVar15;
  long lVar16;
  long lVar18;
  undefined1 *puVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  bool bVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  int iVar32;
  double in_XMM4_Qa;
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>_>
  pVar37;
  value_type e;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
  __begin1;
  Vec2d param [3];
  Vec3d pos3d [3];
  double local_198 [3];
  undefined8 local_180;
  ulong local_178;
  VectorXd *local_170;
  undefined1 local_168 [16];
  double local_158 [4];
  double local_138 [4];
  double local_118;
  double dStack_110;
  undefined1 local_108 [16];
  double local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  long local_d0;
  key_type local_c8;
  double adStack_c0 [4];
  double dStack_a0;
  undefined1 local_98 [16];
  double local_80;
  double dStack_78;
  double local_70;
  double local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  ulong uVar17;
  
  local_108._8_4_ = in_XMM0_Dc;
  local_108._0_8_ = epsilon;
  local_108._12_4_ = in_XMM0_Dd;
  local_170 = x;
  initHashMap(mesh,x,epsilon);
  auVar35 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
  uVar17 = auVar35._8_8_;
  local_168 = auVar35;
  auVar36 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
  if (auVar35._8_4_ != auVar36._8_4_ || auVar35._0_8_ != auVar36._0_8_) {
    do {
      local_180 = auVar36._8_8_;
      local_178 = auVar36._0_8_;
      uVar15 = *(uint *)(*(long *)&(mesh->super_Mesh).
                                   super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                                   .super_PolyConnectivity.field_0xf8 + (long)(int)uVar17 * 4);
      if (-1 < (int)uVar15) {
        lVar12 = *(long *)&(mesh->super_Mesh).
                           super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                           .super_PolyConnectivity.field_0xe0;
        lVar4 = *(long *)(*(long *)(*(long *)&(mesh->super_Mesh).
                                              super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                                              .super_PolyConnectivity.field_0x10 +
                                   (long)(mesh->super_Mesh).
                                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                                         .points_.
                                         super_BasePropHandleT<OpenMesh::VectorT<float,_3>_>.
                                         super_BaseHandle.idx_ * 8) + 0x30);
        pdVar5 = (local_170->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        lVar18 = 0;
        puVar19 = local_98;
        uVar20 = 0;
        uVar21 = uVar15;
        do {
          lVar14 = (long)((int)uVar21 >> 1) * 0x20 + lVar12;
          lVar16 = (long)*(int *)((ulong)((uVar21 & 1) << 4) + 4 + lVar14);
          lVar22 = 0;
          do {
            *(double *)(puVar19 + lVar22 * 2) = (double)*(float *)(lVar4 + lVar16 * 0xc + lVar22);
            lVar22 = lVar22 + 4;
          } while (lVar22 != 0xc);
          pdVar1 = pdVar5 + lVar16 * 2;
          dVar34 = pdVar1[1];
          adStack_c0[lVar18 * 2 + -1] = *pdVar1;
          adStack_c0[lVar18 * 2] = dVar34;
          lVar18 = lVar18 + 1;
          uVar21 = *(uint *)(lVar14 + 8 + (ulong)((uVar21 & 1) << 4));
          uVar20 = uVar20 + (uVar21 == uVar15);
          puVar19 = puVar19 + 0x18;
        } while ((uVar21 != uVar15) || (uVar20 != ~uVar15 >> 0x1f));
        in_XMM4_Qa = (double)CONCAT44(local_c8.values_._M_elems[1],local_c8.values_._M_elems[0]);
      }
      local_198[2] = local_70;
      local_198[0] = local_80;
      local_198[1] = dStack_78;
      lVar12 = 0;
      do {
        local_198[lVar12] = local_198[lVar12] - *(double *)(local_98 + lVar12 * 8);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      auVar28._0_8_ = adStack_c0[1] - in_XMM4_Qa;
      auVar28._8_8_ = adStack_c0[2] - adStack_c0[0];
      dVar34 = SQRT(local_198[2] * local_198[2] +
                    local_198[1] * local_198[1] + local_198[0] * local_198[0]);
      auVar35._8_4_ = SUB84(dVar34,0);
      auVar35._0_8_ = dVar34;
      auVar35._12_4_ = (int)((ulong)dVar34 >> 0x20);
      auVar35 = divpd(auVar28,auVar35);
      local_198[2] = (double)local_58;
      local_198[0] = local_68;
      local_198[1] = (double)uStack_60;
      lVar12 = 0;
      do {
        local_198[lVar12] = local_198[lVar12] - *(double *)(local_98 + lVar12 * 8);
        dVar34 = local_198[0];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      local_138[2] = local_198[2];
      local_138[1] = local_198[1];
      local_198[2] = local_70;
      local_198[0] = local_80;
      local_198[1] = dStack_78;
      lVar12 = 0;
      do {
        local_198[lVar12] = local_198[lVar12] - *(double *)(local_98 + lVar12 * 8);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      local_158[2] = local_198[2];
      local_158[1] = local_198[1];
      dVar34 = dVar34 * local_198[0];
      lVar12 = 8;
      do {
        dVar34 = dVar34 + *(double *)((long)local_138 + lVar12) *
                          *(double *)((long)local_158 + lVar12);
        lVar12 = lVar12 + 8;
      } while (lVar12 != 0x18);
      local_198[2] = local_70;
      local_198[0] = local_80;
      local_198[1] = dStack_78;
      lVar12 = 0;
      do {
        local_198[lVar12] = local_198[lVar12] - *(double *)(local_98 + lVar12 * 8);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      dVar33 = local_198[0] * local_198[0];
      dVar26 = local_198[1] * local_198[1];
      dVar30 = local_198[2] * local_198[2];
      local_198[2] = (double)local_58;
      local_198[0] = local_68;
      local_198[1] = (double)uStack_60;
      lVar12 = 0;
      do {
        local_198[lVar12] = local_198[lVar12] - *(double *)(local_98 + lVar12 * 8);
        dVar7 = local_198[0];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      local_138[2] = local_198[2];
      local_138[0] = local_198[0];
      local_138[1] = local_198[1];
      local_198[2] = (double)local_58;
      local_198[0] = local_68;
      local_198[1] = (double)uStack_60;
      lVar12 = 0;
      do {
        local_198[lVar12] = local_198[lVar12] - *(double *)(local_98 + lVar12 * 8);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      local_158[2] = local_198[2];
      local_158[0] = local_198[0];
      local_158[1] = local_198[1];
      dVar7 = dVar7 * local_198[0];
      lVar12 = 8;
      do {
        dVar7 = dVar7 + *(double *)((long)local_138 + lVar12) *
                        *(double *)((long)local_158 + lVar12);
        lVar12 = lVar12 + 8;
      } while (lVar12 != 0x18);
      dVar34 = dVar34 / SQRT(dVar30 + dVar26 + dVar33);
      dVar7 = dVar7 - dVar34 * dVar34;
      if (dVar7 < 0.0) {
        dStack_110 = adStack_c0[0];
        uStack_f0 = 0;
        local_118 = in_XMM4_Qa;
        local_f8 = dVar34;
        local_e8 = auVar35;
        dVar7 = sqrt(dVar7);
        auVar36._8_8_ = local_180;
        auVar36._0_8_ = local_178;
        auVar35 = local_e8;
        in_XMM4_Qa = local_118;
        dVar33 = dStack_110;
        dVar34 = local_f8;
      }
      else {
        dVar7 = SQRT(dVar7);
        dVar33 = adStack_c0[0];
      }
      local_180 = auVar36._8_8_;
      local_178 = auVar36._0_8_;
      auVar27._0_8_ = (adStack_c0[3] - in_XMM4_Qa) - dVar34 * auVar35._0_8_;
      auVar27._8_8_ = (dStack_a0 - dVar33) - dVar34 * auVar35._8_8_;
      auVar6._8_4_ = SUB84(dVar7,0);
      auVar6._0_8_ = dVar7;
      auVar6._12_4_ = (int)((ulong)dVar7 >> 0x20);
      auVar28 = divpd(auVar27,auVar6);
      if (auVar28._8_8_ * auVar35._0_8_ - auVar35._8_8_ * auVar28._0_8_ < 0.0) {
        return false;
      }
      uVar15 = local_168._8_4_ + 1;
      local_168._8_4_ = uVar15;
      if (local_168._12_4_ != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    *)local_168);
        auVar36._8_8_ = local_180;
        auVar36._0_8_ = local_178;
        uVar15 = local_168._8_4_;
      }
      local_178 = auVar36._0_8_;
      uVar17 = (ulong)uVar15;
      local_180._0_4_ = auVar36._8_4_;
    } while (uVar15 != (uint)local_180 || local_168._0_8_ != local_178);
  }
  local_180 = auVar36._8_8_;
  local_178 = auVar36._0_8_;
  auVar36 = OpenMesh::PolyConnectivity::edges_begin((PolyConnectivity *)mesh);
  uVar17 = auVar36._8_8_;
  local_98 = auVar36;
  auVar35 = OpenMesh::PolyConnectivity::edges_end((PolyConnectivity *)mesh);
  lVar12 = auVar35._0_8_;
  local_e8._0_8_ = auVar35._8_8_;
  if (auVar36._0_8_ != lVar12 || auVar36._8_4_ != auVar35._8_4_) {
    local_48 = local_108._0_4_;
    uStack_44 = local_108._4_4_;
    uStack_40 = local_108._0_4_;
    uStack_3c = local_108._4_4_;
    do {
      iVar11 = (int)uVar17;
      local_198[0] = (double)CONCAT44(local_198[0]._4_4_,iVar11);
      lVar4 = *(long *)&(mesh->super_Mesh).
                        super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                        .super_PolyConnectivity.field_0xe0;
      lVar18 = ((long)(uVar17 << 0x21) >> 0x21) * 0x20;
      if ((*(int *)(lVar4 + lVar18) < 0) || (*(int *)(lVar4 + 0x10 + lVar18) < 0)) {
        iVar2 = *(int *)(lVar4 + lVar18 + 0x14);
        iVar3 = *(int *)(lVar4 + lVar18 + 4);
        pdVar5 = (local_170->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        dVar34 = pdVar5[(long)iVar2 * 2];
        dVar33 = pdVar5[(long)iVar3 * 2];
        auVar29._0_8_ = (ulong)dVar33 & -(ulong)(dVar33 < dVar34);
        auVar29._8_8_ = (ulong)dVar33 & -(ulong)(dVar34 < dVar33);
        auVar31._0_8_ = ~-(ulong)(dVar33 < dVar34) & (ulong)dVar34;
        auVar31._8_8_ = ~-(ulong)(dVar34 < dVar33) & (ulong)dVar34;
        auVar8._4_4_ = uStack_44;
        auVar8._0_4_ = local_48;
        auVar8._8_4_ = uStack_40;
        auVar8._12_4_ = uStack_3c;
        auVar36 = divpd(auVar31 | auVar29,auVar8);
        uVar15 = (uint)(auVar36._0_8_ + -1.0);
        iVar32 = (int)(auVar36._8_8_ + 1.0);
        dVar34 = pdVar5[iVar3 * 2 + 1];
        uVar24 = SUB84(dVar34,0);
        uVar25 = (undefined4)((ulong)dVar34 >> 0x20);
        dVar33 = pdVar5[iVar2 * 2 + 1];
        dVar26 = dVar34;
        if (dVar33 <= dVar34) {
          dVar26 = dVar33;
        }
        local_f8 = (double)CONCAT44(local_f8._4_4_,iVar32);
        if ((int)uVar15 <= iVar32) {
          iVar11 = (int)(dVar26 / (double)local_108._0_8_ + -1.0);
          if (dVar34 <= dVar33) {
            uVar24 = SUB84(dVar33,0);
            uVar25 = (undefined4)((ulong)dVar33 >> 0x20);
          }
          iVar32 = (int)((double)CONCAT44(uVar25,uVar24) / (double)local_108._0_8_ + 1.0);
          local_118 = (double)CONCAT44(local_118._4_4_,iVar11);
          local_180 = CONCAT44(local_180._4_4_,iVar32);
          local_d0 = lVar12;
          do {
            uVar21 = uVar15;
            if (iVar11 <= iVar32) {
              iVar11 = local_118._0_4_;
              local_178 = (ulong)uVar15;
              do {
                local_c8.values_._M_elems[0] = (int)local_178;
                local_c8.values_._M_elems[1] = iVar11;
                pVar37 = std::
                         _Hashtable<OpenMesh::VectorT<int,_2>,_std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_std::allocator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>,_std::__detail::_Select1st,_std::equal_to<OpenMesh::VectorT<int,_2>_>,_myHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                         ::equal_range(&neighbors._M_h,&local_c8);
                iVar10 = local_c8.values_._M_elems[0];
                for (_Var13._M_cur =
                          (__node_type *)
                          pVar37.first.
                          super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                          ._M_cur;
                    (_Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>)
                    _Var13._M_cur !=
                    pVar37.second.
                    super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                    ._M_cur.
                    super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                    ; _Var13._M_cur = (__node_type *)((_Var13._M_cur)->super__Hash_node_base)._M_nxt
                    ) {
                  local_c8.values_._M_elems[0] =
                       *(int *)((long)&((_Var13._M_cur)->
                                       super__Hash_node_value<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                                       ).
                                       super__Hash_node_value_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>
                                       ._M_storage._M_storage + 8);
                  if ((local_c8.values_._M_elems[0] != iVar2) &&
                     (local_c8.values_._M_elems[0] != iVar3)) {
                    dVar34 = getDistance(mesh,local_170,(EdgeHandle *)local_198,
                                         (VertexHandle *)&local_c8);
                    iVar10 = local_c8.values_._M_elems[0];
                    if ((dVar34 == 0.0) && (!NAN(dVar34))) {
                      return false;
                    }
                  }
                  local_c8.values_._M_elems[0] = iVar10;
                  iVar10 = local_c8.values_._M_elems[0];
                }
                bVar23 = iVar11 != (uint)local_180;
                uVar21 = (uint)local_178;
                iVar32 = (uint)local_180;
                iVar11 = iVar11 + 1;
                local_c8.values_._M_elems[0] = iVar10;
              } while (bVar23);
            }
            uVar15 = uVar21 + 1;
            iVar11 = local_118._0_4_;
          } while (uVar21 != local_f8._0_4_);
          iVar11 = local_98._8_4_;
          lVar12 = local_d0;
        }
      }
      local_98._8_4_ = iVar11 + 1U;
      uVar15 = iVar11 + 1U;
      if (local_98._12_4_ != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                    *)local_98);
        uVar15 = local_98._8_4_;
      }
      auVar9._8_8_ = local_98._8_8_;
      auVar9._0_8_ = local_98._0_8_;
      uVar17 = (ulong)uVar15;
    } while ((local_98._0_8_ != lVar12) || (local_98 = auVar9, uVar15 != local_e8._0_4_));
  }
  return true;
}

Assistant:

bool checkCreterion(const Mesh& mesh, const Eigen::VectorXd& x, double epsilon) {
    initHashMap(mesh, x, epsilon);
    for (auto f: mesh.all_faces()) {
        // get the vertices associated with this triangle
        OpenMesh::VertexHandle vs[3];
        OpenMesh::Vec2d param[3];
        OpenMesh::Vec3d pos3d[3];
        OpenMesh::Vec2d u1 = param[1] - param[0];
        OpenMesh::Vec2d u2 = param[2] - param[0];

        if (u2[1] * u1[0] == u2[0] * u1[1])
            return false;

        int count = 0;
        for (auto v: mesh.fv_range(f)) {
            vs[count] = v;
            pos3d[count] = mesh.point(v);
            param[count] = OpenMesh::Vec2d(x[v.idx() * 2], x[v.idx() * 2 + 1]);
            ++count;
        }
        // check non-flip and bijective
        OpenMesh::Vec2d e1 = (param[1] - param[0]) / (pos3d[1] - pos3d[0]).norm();
        double xc = OpenMesh::dot(pos3d[2] - pos3d[0], pos3d[1] - pos3d[0]) / (pos3d[1] - pos3d[0]).norm();
        double yc = sqrt(OpenMesh::dot(pos3d[2] - pos3d[0], pos3d[2] - pos3d[0]) - xc * xc);
        OpenMesh::Vec2d e2 =  (param[2] - param[0] - e1 * xc) / yc; 
        double x00 = e1[0];
        double x10 = e1[1];
        double x01 = e2[0];
        double x11 = e2[1];
        double det = x00 * x11 - x01 * x10;
        if (det < 0.0)
            return false;
    }

    // check the degeneration of boundary points
    for (auto e: mesh.all_edges())
        if (mesh.is_boundary(e)) {
            int st = mesh.from_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
            int end = mesh.to_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
            // The range for neighborhood searching
            int x_st = std::min(x[2 * st], x[2 * end]) / epsilon - 1;
            int x_end = std::max(x[2 * st], x[2 * end]) / epsilon + 1;
            int y_st = std::min(x[2 * st + 1], x[2 * end + 1]) / epsilon - 1;
            int y_end = std::max(x[2 * st + 1], x[2 * end + 1]) / epsilon + 1;
            // conduct neighbor search for neighbor boundaries points
            for (int xs = x_st; xs <= x_end; ++xs)
                for (int y = y_st; y <= y_end; ++y) {
                    auto itr_pr = neighbors.equal_range(OpenMesh::Vec2i(xs, y));
                    for (auto itr = itr_pr.first; itr != itr_pr.second; ++itr)
                        if (itr->second != st && itr->second != end) {
                            double dis = getDistance(mesh, x, e, OpenMesh::VertexHandle(itr->second));
                            if (dis == 0.0)
                                return false;
                        }
                    }
        }
    return true;
}